

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O0

bool dxil_spv::emit_ray_query_commit_procedural_primitive_instruction
               (Impl *impl,CallInst *instruction)

{
  CallInst *this;
  bool bVar1;
  Id arg;
  Value *pVVar2;
  Operation *this_00;
  Operation *op;
  CallInst *pCStack_20;
  Id ray_object_id;
  CallInst *instruction_local;
  Impl *impl_local;
  
  op._4_4_ = 0;
  pCStack_20 = instruction;
  instruction_local = (CallInst *)impl;
  pVVar2 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = build_ray_query_object(impl,pVVar2,(Id *)((long)&op + 4),(uint32_t *)0x0);
  if (bVar1) {
    this_00 = Converter::Impl::allocate((Impl *)instruction_local,OpRayQueryGenerateIntersectionKHR)
    ;
    Operation::add_id(this_00,op._4_4_);
    this = instruction_local;
    pVVar2 = LLVMBC::Instruction::getOperand(&pCStack_20->super_Instruction,2);
    arg = Converter::Impl::get_id_for_value((Impl *)this,pVVar2,0);
    Operation::add_id(this_00,arg);
    Converter::Impl::add((Impl *)instruction_local,this_00,false);
  }
  return bVar1;
}

Assistant:

bool emit_ray_query_commit_procedural_primitive_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	spv::Id ray_object_id = 0;
	if (!build_ray_query_object(impl, instruction->getOperand(1), ray_object_id))
		return false;

	auto *op = impl.allocate(spv::OpRayQueryGenerateIntersectionKHR);
	op->add_id(ray_object_id);
	op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
	impl.add(op);
	return true;
}